

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

BrandedDecl * __thiscall
capnp::compiler::NodeTranslator::BrandScope::decompileType
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,Reader type)

{
  short sVar1;
  Reader type_00;
  Reader subSource;
  undefined1 auVar2 [40];
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  BrandedDecl *pBVar3;
  size_t sVar4;
  undefined8 uVar5;
  SegmentReader *pSVar6;
  CapTableReader *pCVar7;
  BrandScope *pBVar8;
  SegmentReader *pSVar9;
  undefined4 uVar10;
  Which which;
  int iVar11;
  undefined8 uVar12;
  undefined1 unaff_BPL;
  _func_int *p_Var13;
  void *scopeId;
  uint uVar14;
  bool bVar15;
  anon_class_16_2_36210f71 builtin;
  ResolvedDecl decl;
  BrandedDecl elementType;
  anon_class_16_2_36210f71 local_6f8;
  undefined1 local_6e8 [12];
  undefined4 uStack_6dc;
  WirePointer *local_6d8;
  int iStack_6d0;
  undefined4 uStack_6cc;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  byte bStack_6b0;
  undefined7 uStack_6af;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  StructReader *local_678;
  BrandScope *local_670;
  SegmentReader *local_668;
  CapTableReader *pCStack_660;
  void *local_658;
  WirePointer *pWStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  uint local_638;
  undefined4 uStack_634;
  uint uStack_630;
  undefined4 uStack_62c;
  Array<capnp::compiler::NodeTranslator::BrandedDecl> local_628;
  Maybe<capnp::compiler::NodeTranslator::BrandedDecl> local_608;
  WirePointer *local_550;
  int iStack_548;
  undefined4 uStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  void *local_528;
  undefined8 uStack_520;
  WirePointer *local_518;
  int iStack_510;
  undefined4 uStack_50c;
  undefined8 local_508;
  void *local_4f8;
  undefined8 uStack_4f0;
  WirePointer *local_4e8;
  int iStack_4e0;
  undefined4 uStack_4dc;
  undefined8 local_4d8;
  void *local_4c8;
  undefined8 uStack_4c0;
  WirePointer *local_4b8;
  int iStack_4b0;
  undefined4 uStack_4ac;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  void *local_458;
  WirePointer *pWStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined1 local_3a8 [40];
  byte local_380;
  undefined8 local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined1 local_348 [40];
  byte local_320;
  undefined8 local_318;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [40];
  byte local_2c0;
  undefined8 local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  BrandedDecl local_248;
  BrandedDecl local_198;
  StructReader local_f0;
  ListReader local_c0;
  ListReader local_90;
  ListReader local_60;
  
  local_6f8.resolver = resolver;
  local_6f8.this = this;
  if (type._reader.dataSize < 0x10) {
switchD_001c8178_caseD_0:
    which = BUILTIN_VOID;
    goto LAB_001c8134;
  }
  local_198.body.field_1._8_8_ = type._reader.pointers;
  switch(*type._reader.data) {
  case 0:
    goto switchD_001c8178_caseD_0;
  case 1:
    which = BUILTIN_BOOL;
    break;
  case 2:
    which = BUILTIN_INT8;
    break;
  case 3:
    which = BUILTIN_INT16;
    break;
  case 4:
    which = BUILTIN_INT32;
    break;
  case 5:
    which = BUILTIN_INT64;
    break;
  case 6:
    which = BUILTIN_U_INT8;
    break;
  case 7:
    which = BUILTIN_U_INT16;
    break;
  case 8:
    which = BUILTIN_U_INT32;
    break;
  case 9:
    which = BUILTIN_U_INT64;
    break;
  case 10:
    which = BUILTIN_FLOAT32;
    break;
  case 0xb:
    which = BUILTIN_FLOAT64;
    break;
  case 0xc:
    which = BUILTIN_TEXT;
    break;
  case 0xd:
    which = BUILTIN_DATA;
    break;
  case 0xe:
    bVar15 = type._reader.pointerCount == 0;
    local_6d8 = type._reader.pointers;
    if (bVar15) {
      local_6d8 = (WirePointer *)0x0;
    }
    iVar11 = 0x7fffffff;
    if (!bVar15) {
      iVar11 = type._reader.nestingLimit;
    }
    local_6e8._0_4_ = 0;
    local_6e8._4_4_ = 0;
    local_6e8._8_4_ = 0;
    uStack_6dc = 0;
    if (!bVar15) {
      local_6e8._0_4_ = (uint)type._reader.segment;
      local_6e8._4_4_ = type._reader.segment._4_4_;
      local_6e8._8_4_ = (uint)type._reader.capTable;
      uStack_6dc = type._reader.capTable._4_4_;
    }
    iStack_6d0 = iVar11;
    uVar12 = &local_f0;
    capnp::_::PointerReader::getStruct
              ((StructReader *)uVar12,(PointerReader *)local_6e8,(word *)0x0);
    type_00._reader.capTable = local_f0.capTable;
    type_00._reader.segment = local_f0.segment;
    type_00._reader.data = local_f0.data;
    type_00._reader.pointers = local_f0.pointers;
    type_00._reader.dataSize = local_f0.dataSize;
    type_00._reader.pointerCount = local_f0.pointerCount;
    type_00._reader._38_2_ = local_f0._38_2_;
    type_00._reader.nestingLimit = local_f0.nestingLimit;
    type_00._reader._44_4_ = local_f0._44_4_;
    decompileType(&local_198,this,resolver,type_00);
    decompileType::anon_class_16_2_36210f71::operator()(&local_248,&local_6f8,BUILTIN_LIST);
    kj::heapArray<capnp::compiler::NodeTranslator::BrandedDecl>(&local_628,&local_198,1);
    local_478 = 0;
    local_488 = 0;
    uStack_480 = 0;
    local_498 = 0;
    uStack_490 = 0;
    uStack_470 = 0x7fffffff;
    auVar2 = ZEXT1640(ZEXT816(0));
    subSource._reader._40_8_ = 0x7fffffff;
    subSource._reader.segment = (SegmentReader *)auVar2._0_8_;
    subSource._reader.capTable = (CapTableReader *)auVar2._8_8_;
    subSource._reader.data = (void *)auVar2._16_8_;
    subSource._reader.pointers = (WirePointer *)auVar2._24_8_;
    subSource._reader.dataSize = auVar2._32_4_;
    subSource._reader.pointerCount = auVar2._36_2_;
    subSource._reader._38_2_ = auVar2._38_2_;
    BrandedDecl::applyParams(&local_608,&local_248,&local_628,subSource);
    uVar5 = local_608.ptr.field_1.value.brand.ptr;
    sVar4 = local_628.size_;
    pBVar3 = local_628.ptr;
    local_6e8[0] = local_608.ptr.isSet;
    if (local_608.ptr.isSet == true) {
      resolver = (Resolver *)(local_608.ptr.field_1._0_8_ & 0xffffffff);
      local_6e8._8_4_ = local_608.ptr.field_1.value.body.tag;
      if (local_608.ptr.field_1.value.body.tag == 2) {
        local_6d8 = (WirePointer *)local_608.ptr.field_1._8_8_;
        _iStack_6d0 = local_608.ptr.field_1._16_8_;
      }
      else if (local_608.ptr.field_1.value.body.tag == 1) {
        local_6b8 = local_608.ptr.field_1._40_8_;
        local_6c8 = CONCAT26(local_608.ptr.field_1._30_2_,
                             CONCAT24(local_608.ptr.field_1._28_2_,local_608.ptr.field_1._24_4_));
        uStack_6c0 = CONCAT44(local_608.ptr.field_1._36_4_,local_608.ptr.field_1._32_4_);
        local_6d8 = (WirePointer *)local_608.ptr.field_1._8_8_;
        _iStack_6d0 = local_608.ptr.field_1._16_8_;
        bStack_6b0 = local_608.ptr.field_1._48_1_;
        unaff_BPL = local_608.ptr.field_1._48_1_;
        if (local_608.ptr.field_1._48_1_ == 1) {
          local_688 = local_608.ptr.field_1._88_8_;
          uStack_680 = local_608.ptr.field_1._96_8_;
          local_698 = local_608.ptr.field_1._72_8_;
          uStack_690 = local_608.ptr.field_1._80_8_;
          local_6a8 = local_608.ptr.field_1._56_8_;
          uStack_6a0 = local_608.ptr.field_1._64_8_;
        }
      }
      local_678 = (StructReader *)local_608.ptr.field_1.value.brand.disposer;
      local_670 = local_608.ptr.field_1.value.brand.ptr;
      local_608.ptr.field_1.value.brand.ptr = (BrandScope *)0x0;
      local_668 = local_608.ptr.field_1.value.source._reader.segment;
      pCStack_660 = local_608.ptr.field_1.value.source._reader.capTable;
      local_658 = local_608.ptr.field_1.value.source._reader.data;
      pWStack_650 = local_608.ptr.field_1.value.source._reader.pointers;
      local_648 = local_608.ptr.field_1._152_8_;
      uStack_640 = local_608.ptr.field_1._160_8_;
      uVar10 = 0;
      if (1 < local_608.ptr.field_1.value.body.tag - 1) {
        uVar10 = local_608.ptr.field_1.value.body.tag;
      }
      local_608.ptr.field_1.value.body.tag = uVar10;
      uVar12 = local_608.ptr.field_1.value.brand.disposer;
      this = (BrandScope *)uVar5;
    }
    if (local_628.ptr != (BrandedDecl *)0x0) {
      local_628.ptr = (BrandedDecl *)0x0;
      local_628.size_ = 0;
      (**(local_628.disposer)->_vptr_ArrayDisposer)
                (local_628.disposer,pBVar3,0xa8,sVar4,sVar4,
                 kj::ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::BrandedDecl,_false>::
                 destruct);
    }
    pBVar8 = local_248.brand.ptr;
    if (local_248.brand.ptr != (BrandScope *)0x0) {
      local_248.brand.ptr = (BrandScope *)0x0;
      (**(local_248.brand.disposer)->_vptr_Disposer)
                (local_248.brand.disposer,
                 (pBVar8->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                 (long)&(pBVar8->super_Refcounted).super_Disposer._vptr_Disposer);
    }
    pBVar8 = local_198.brand.ptr;
    if (local_608.ptr.isSet == false) {
      local_248.body.tag = 0;
      local_248.body._4_4_ = 0;
      local_608.ptr._0_8_ = (SegmentReader *)0x0;
      local_608.ptr.field_1._0_8_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_248,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_248);
    }
    uVar14 = (uint)resolver;
    if (uVar14 == 2) {
      local_550 = local_6d8;
      iStack_548 = iStack_6d0;
      uStack_544 = uStack_6cc;
    }
    else if (uVar14 == 1) {
      local_530 = local_6b8;
      local_540 = local_6c8;
      uStack_538 = uStack_6c0;
      local_550 = local_6d8;
      iStack_548 = iStack_6d0;
      uStack_544 = uStack_6cc;
      if ((unaff_BPL & 1) != 0) {
        local_258 = local_688;
        uStack_250 = uStack_680;
        local_268 = local_698;
        uStack_260 = uStack_690;
        local_278 = local_6a8;
        uStack_270 = uStack_6a0;
      }
    }
    local_448 = local_648;
    uStack_440 = uStack_640;
    local_458 = local_658;
    pWStack_450 = pWStack_650;
    local_468 = local_668;
    pSVar6 = local_468;
    uStack_460 = pCStack_660;
    pCVar7 = uStack_460;
    (__return_storage_ptr__->body).tag = uVar14;
    if (uVar14 == 2) {
      (__return_storage_ptr__->body).field_1.forceAligned = local_550;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = _iStack_548;
    }
    else if (uVar14 == 1) {
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) = local_530;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x10) = local_540;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = uStack_538;
      (__return_storage_ptr__->body).field_1.forceAligned = local_550;
      *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = _iStack_548;
      (__return_storage_ptr__->body).field_1.space[0x28] = unaff_BPL;
      if ((unaff_BPL & 1) != 0) {
        *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x50) = local_258;
        *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x58) = uStack_250;
        *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x40) = local_268;
        *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x48) = uStack_260;
        *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x30) = local_278;
        *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x38) = uStack_270;
      }
    }
    (__return_storage_ptr__->brand).disposer = (Disposer *)uVar12;
    (__return_storage_ptr__->brand).ptr = this;
    local_468._0_4_ = SUB84(local_668,0);
    local_468._4_4_ = (undefined4)((ulong)local_668 >> 0x20);
    uStack_460._0_4_ = SUB84(pCStack_660,0);
    uStack_460._4_4_ = (undefined4)((ulong)pCStack_660 >> 0x20);
    (__return_storage_ptr__->source)._reader.dataSize = (undefined4)local_648;
    (__return_storage_ptr__->source)._reader.pointerCount = local_648._4_2_;
    *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = local_648._6_2_;
    *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = uStack_640;
    (__return_storage_ptr__->source)._reader.data = local_658;
    (__return_storage_ptr__->source)._reader.pointers = pWStack_650;
    *(undefined4 *)&(__return_storage_ptr__->source)._reader.segment = (undefined4)local_468;
    *(undefined4 *)((long)&(__return_storage_ptr__->source)._reader.segment + 4) = local_468._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->source)._reader.capTable = (undefined4)uStack_460;
    *(undefined4 *)((long)&(__return_storage_ptr__->source)._reader.capTable + 4) = uStack_460._4_4_
    ;
    if (local_198.brand.ptr == (BrandScope *)0x0) {
      return __return_storage_ptr__;
    }
    local_198.brand.ptr = (BrandScope *)0x0;
    p_Var13 = (pBVar8->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
              (long)&(pBVar8->super_Refcounted).super_Disposer._vptr_Disposer;
    pSVar9 = (SegmentReader *)(local_198.brand.disposer)->_vptr_Disposer;
    local_608.ptr.field_1.value.brand.disposer = local_198.brand.disposer;
    local_468 = pSVar6;
    uStack_460 = pCVar7;
    goto LAB_001c8e3c;
  case 0xf:
    if (type._reader.dataSize < 0x80) {
      uVar12 = 0;
    }
    else {
      uVar12 = *(undefined8 *)((long)type._reader.data + 8);
    }
    local_638 = (uint)type._reader.segment;
    uStack_634 = type._reader.segment._4_4_;
    uStack_630 = (uint)type._reader.capTable;
    uStack_62c = type._reader.capTable._4_4_;
    (*resolver->_vptr_Resolver[3])(local_6e8,resolver,uVar12);
    local_4a8 = local_6c8;
    local_4c8 = (void *)CONCAT44(local_6e8._4_4_,local_6e8._0_4_);
    uStack_4c0 = CONCAT44(uStack_6dc,local_6e8._8_4_);
    local_4b8 = local_6d8;
    iStack_4b0 = iStack_6d0;
    uStack_4ac = uStack_6cc;
    if ((byte)uStack_6c0 != '\0') {
      local_3b8 = local_698;
      uStack_3b0 = uStack_690;
      local_3c8 = local_6a8;
      uStack_3c0 = uStack_6a0;
      uStack_3d0 = CONCAT71(uStack_6af,bStack_6b0);
      local_3d8 = local_6b8;
      local_2b8 = local_6b8;
      local_2a8 = local_6a8;
      uStack_2a0 = uStack_6a0;
      local_298 = local_698;
      uStack_290 = uStack_690;
    }
    local_2c0 = (byte)uStack_6c0;
    if (type._reader.pointerCount == 0) {
      local_198.body.field_1._8_8_ = (WirePointer *)0x0;
    }
    local_198.body.tag = local_638;
    local_198.body._4_4_ = uStack_634;
    local_198.body.field_1._0_4_ = uStack_630;
    local_198.body.field_1._4_4_ = uStack_62c;
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      local_198.body.tag = 0;
      local_198.body._4_4_ = 0;
      local_198.body.field_1._0_4_ = 0;
      local_198.body.field_1._4_4_ = 0;
    }
    local_198.body.field_1._16_4_ = type._reader.nestingLimit;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_608,(PointerReader *)&local_198,(word *)0x0);
    local_198.body.field_1._8_4_ = 0;
    local_198.body.field_1._12_4_ = 0;
    local_198.body.field_1._16_4_ = 0x7fffffff;
    if (local_608.ptr.field_1._28_2_ != 0) {
      local_198.body.field_1._8_8_ = local_608.ptr.field_1._16_8_;
      local_198.body.field_1._16_4_ = local_608.ptr.field_1._32_4_;
    }
    local_198.body.tag = 0;
    local_198.body._4_4_ = 0;
    local_198.body.field_1._0_4_ = 0;
    local_198.body.field_1._4_4_ = 0;
    if (local_608.ptr.field_1._28_2_ != 0) {
      local_198.body.tag = local_608.ptr._0_4_;
      local_198.body._4_4_ = local_608.ptr._4_4_;
      local_198.body.field_1._0_4_ = local_608.ptr.field_1.value.body.tag;
      local_198.body.field_1._4_4_ = local_608.ptr.field_1._4_4_;
    }
    capnp::_::PointerReader::getList
              (&local_60,(PointerReader *)&local_198,INLINE_COMPOSITE,(word *)0x0);
    brand_00.reader.capTable = local_60.capTable;
    brand_00.reader.segment = local_60.segment;
    brand_00.reader.ptr = local_60.ptr;
    brand_00.reader.elementCount = local_60.elementCount;
    brand_00.reader.step = local_60.step;
    brand_00.reader.structDataSize = local_60.structDataSize;
    brand_00.reader.structPointerCount = local_60.structPointerCount;
    brand_00.reader.elementSize = local_60.elementSize;
    brand_00.reader._39_1_ = local_60._39_1_;
    brand_00.reader.nestingLimit = local_60.nestingLimit;
    brand_00.reader._44_4_ = local_60._44_4_;
    evaluateBrand((BrandScope *)&local_248,(Resolver *)this,(ResolvedDecl *)resolver,brand_00,
                  (uint)local_2e8);
    (__return_storage_ptr__->source)._reader.data = (void *)0x0;
    (__return_storage_ptr__->source)._reader.pointers = (WirePointer *)0x0;
    (__return_storage_ptr__->source)._reader.segment = (SegmentReader *)0x0;
    (__return_storage_ptr__->source)._reader.capTable = (CapTableReader *)0x0;
    (__return_storage_ptr__->source)._reader.dataSize = 0;
    (__return_storage_ptr__->source)._reader.pointerCount = 0;
    *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = 0;
    (__return_storage_ptr__->brand).disposer = (Disposer *)local_248.body._0_8_;
    (__return_storage_ptr__->brand).ptr = (BrandScope *)local_248.body.field_1.forceAligned;
    *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = 0x7fffffff;
    (__return_storage_ptr__->body).field_1.forceAligned = local_4c8;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uStack_4c0;
    *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 0x10) = local_4b8;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = _iStack_4b0;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) = local_4a8;
    (__return_storage_ptr__->body).field_1.space[0x28] = (byte)uStack_6c0;
    if ((byte)uStack_6c0 == '\0') goto LAB_001c8bc5;
    local_408._0_4_ = (undefined4)local_3d8;
    local_408._4_4_ = local_3d8._4_4_;
    uStack_400._0_4_ = (undefined4)uStack_3d0;
    uStack_400._4_4_ = uStack_3d0._4_4_;
    local_3f8._0_4_ = (undefined4)local_3c8;
    local_3f8._4_4_ = local_3c8._4_4_;
    uStack_3f0._0_4_ = (undefined4)uStack_3c0;
    uStack_3f0._4_4_ = uStack_3c0._4_4_;
    local_3e8._0_4_ = (undefined4)local_3b8;
    local_3e8._4_4_ = local_3b8._4_4_;
    uStack_3e0._0_4_ = (undefined4)uStack_3b0;
    uStack_3e0._4_4_ = uStack_3b0._4_4_;
    goto LAB_001c8bb9;
  case 0x10:
    if (type._reader.dataSize < 0x80) {
      uVar12 = 0;
    }
    else {
      uVar12 = *(undefined8 *)((long)type._reader.data + 8);
    }
    local_638 = (uint)type._reader.segment;
    uStack_634 = type._reader.segment._4_4_;
    uStack_630 = (uint)type._reader.capTable;
    uStack_62c = type._reader.capTable._4_4_;
    (*resolver->_vptr_Resolver[3])(local_6e8,resolver,uVar12);
    local_508 = local_6c8;
    local_528 = (void *)CONCAT44(local_6e8._4_4_,local_6e8._0_4_);
    uStack_520 = CONCAT44(uStack_6dc,local_6e8._8_4_);
    local_518 = local_6d8;
    iStack_510 = iStack_6d0;
    uStack_50c = uStack_6cc;
    if ((byte)uStack_6c0 != '\0') {
      local_418 = local_698;
      uStack_410 = uStack_690;
      local_428 = local_6a8;
      uStack_420 = uStack_6a0;
      uStack_430 = CONCAT71(uStack_6af,bStack_6b0);
      local_438 = local_6b8;
      local_378 = local_6b8;
      local_368 = local_6a8;
      uStack_360 = uStack_6a0;
      local_358 = local_698;
      uStack_350 = uStack_690;
    }
    local_380 = (byte)uStack_6c0;
    if (type._reader.pointerCount == 0) {
      local_198.body.field_1._8_8_ = (WirePointer *)0x0;
    }
    local_198.body.tag = local_638;
    local_198.body._4_4_ = uStack_634;
    local_198.body.field_1._0_4_ = uStack_630;
    local_198.body.field_1._4_4_ = uStack_62c;
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      local_198.body.tag = 0;
      local_198.body._4_4_ = 0;
      local_198.body.field_1._0_4_ = 0;
      local_198.body.field_1._4_4_ = 0;
    }
    local_198.body.field_1._16_4_ = type._reader.nestingLimit;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_608,(PointerReader *)&local_198,(word *)0x0);
    local_198.body.field_1._8_4_ = 0;
    local_198.body.field_1._12_4_ = 0;
    local_198.body.field_1._16_4_ = 0x7fffffff;
    if (local_608.ptr.field_1._28_2_ != 0) {
      local_198.body.field_1._8_8_ = local_608.ptr.field_1._16_8_;
      local_198.body.field_1._16_4_ = local_608.ptr.field_1._32_4_;
    }
    local_198.body.tag = 0;
    local_198.body._4_4_ = 0;
    local_198.body.field_1._0_4_ = 0;
    local_198.body.field_1._4_4_ = 0;
    if (local_608.ptr.field_1._28_2_ != 0) {
      local_198.body.tag = local_608.ptr._0_4_;
      local_198.body._4_4_ = local_608.ptr._4_4_;
      local_198.body.field_1._0_4_ = local_608.ptr.field_1.value.body.tag;
      local_198.body.field_1._4_4_ = local_608.ptr.field_1._4_4_;
    }
    capnp::_::PointerReader::getList
              (&local_c0,(PointerReader *)&local_198,INLINE_COMPOSITE,(word *)0x0);
    brand.reader.capTable = local_c0.capTable;
    brand.reader.segment = local_c0.segment;
    brand.reader.ptr = local_c0.ptr;
    brand.reader.elementCount = local_c0.elementCount;
    brand.reader.step = local_c0.step;
    brand.reader.structDataSize = local_c0.structDataSize;
    brand.reader.structPointerCount = local_c0.structPointerCount;
    brand.reader.elementSize = local_c0.elementSize;
    brand.reader._39_1_ = local_c0._39_1_;
    brand.reader.nestingLimit = local_c0.nestingLimit;
    brand.reader._44_4_ = local_c0._44_4_;
    evaluateBrand((BrandScope *)&local_248,(Resolver *)this,(ResolvedDecl *)resolver,brand,
                  (uint)local_3a8);
    (__return_storage_ptr__->source)._reader.data = (void *)0x0;
    (__return_storage_ptr__->source)._reader.pointers = (WirePointer *)0x0;
    (__return_storage_ptr__->source)._reader.segment = (SegmentReader *)0x0;
    (__return_storage_ptr__->source)._reader.capTable = (CapTableReader *)0x0;
    (__return_storage_ptr__->source)._reader.dataSize = 0;
    (__return_storage_ptr__->source)._reader.pointerCount = 0;
    *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = 0;
    (__return_storage_ptr__->brand).disposer = (Disposer *)local_248.body._0_8_;
    (__return_storage_ptr__->brand).ptr = (BrandScope *)local_248.body.field_1.forceAligned;
    *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = 0x7fffffff;
    (__return_storage_ptr__->body).field_1.forceAligned = local_528;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uStack_520;
    *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 0x10) = local_518;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = _iStack_510;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) = local_508;
    (__return_storage_ptr__->body).field_1.space[0x28] = (byte)uStack_6c0;
    if ((byte)uStack_6c0 == '\0') goto LAB_001c8bc5;
    local_408._0_4_ = (undefined4)local_438;
    local_408._4_4_ = local_438._4_4_;
    uStack_400._0_4_ = (undefined4)uStack_430;
    uStack_400._4_4_ = uStack_430._4_4_;
    local_3f8._0_4_ = (undefined4)local_428;
    local_3f8._4_4_ = local_428._4_4_;
    uStack_3f0._0_4_ = (undefined4)uStack_420;
    uStack_3f0._4_4_ = uStack_420._4_4_;
    local_3e8._0_4_ = (undefined4)local_418;
    local_3e8._4_4_ = local_418._4_4_;
    uStack_3e0._0_4_ = (undefined4)uStack_410;
    uStack_3e0._4_4_ = uStack_410._4_4_;
    goto LAB_001c8bb9;
  case 0x11:
    if (type._reader.dataSize < 0x80) {
      uVar12 = 0;
    }
    else {
      uVar12 = *(undefined8 *)((long)type._reader.data + 8);
    }
    local_638 = (uint)type._reader.segment;
    uStack_634 = type._reader.segment._4_4_;
    uStack_630 = (uint)type._reader.capTable;
    uStack_62c = type._reader.capTable._4_4_;
    (*resolver->_vptr_Resolver[3])(local_6e8,resolver,uVar12);
    local_4d8 = local_6c8;
    local_4f8 = (void *)CONCAT44(local_6e8._4_4_,local_6e8._0_4_);
    uStack_4f0 = CONCAT44(uStack_6dc,local_6e8._8_4_);
    local_4e8 = local_6d8;
    iStack_4e0 = iStack_6d0;
    uStack_4dc = uStack_6cc;
    if ((byte)uStack_6c0 != '\0') {
      local_3e8 = local_698;
      uStack_3e0 = uStack_690;
      local_3f8 = local_6a8;
      uStack_3f0 = uStack_6a0;
      uStack_400 = CONCAT71(uStack_6af,bStack_6b0);
      local_408 = local_6b8;
      local_318 = local_6b8;
      local_308 = local_6a8;
      uStack_300 = uStack_6a0;
      local_2f8 = local_698;
      uStack_2f0 = uStack_690;
    }
    local_320 = (byte)uStack_6c0;
    if (type._reader.pointerCount == 0) {
      local_198.body.field_1._8_8_ = (WirePointer *)0x0;
    }
    local_198.body.tag = local_638;
    local_198.body._4_4_ = uStack_634;
    local_198.body.field_1._0_4_ = uStack_630;
    local_198.body.field_1._4_4_ = uStack_62c;
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      local_198.body.tag = 0;
      local_198.body._4_4_ = 0;
      local_198.body.field_1._0_4_ = 0;
      local_198.body.field_1._4_4_ = 0;
    }
    local_198.body.field_1._16_4_ = type._reader.nestingLimit;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_608,(PointerReader *)&local_198,(word *)0x0);
    local_198.body.field_1._8_4_ = 0;
    local_198.body.field_1._12_4_ = 0;
    local_198.body.field_1._16_4_ = 0x7fffffff;
    if (local_608.ptr.field_1._28_2_ != 0) {
      local_198.body.field_1._8_8_ = local_608.ptr.field_1._16_8_;
      local_198.body.field_1._16_4_ = local_608.ptr.field_1._32_4_;
    }
    local_198.body.tag = 0;
    local_198.body._4_4_ = 0;
    local_198.body.field_1._0_4_ = 0;
    local_198.body.field_1._4_4_ = 0;
    if (local_608.ptr.field_1._28_2_ != 0) {
      local_198.body.tag = local_608.ptr._0_4_;
      local_198.body._4_4_ = local_608.ptr._4_4_;
      local_198.body.field_1._0_4_ = local_608.ptr.field_1.value.body.tag;
      local_198.body.field_1._4_4_ = local_608.ptr.field_1._4_4_;
    }
    capnp::_::PointerReader::getList
              (&local_90,(PointerReader *)&local_198,INLINE_COMPOSITE,(word *)0x0);
    brand_01.reader.capTable = local_90.capTable;
    brand_01.reader.segment = local_90.segment;
    brand_01.reader.ptr = local_90.ptr;
    brand_01.reader.elementCount = local_90.elementCount;
    brand_01.reader.step = local_90.step;
    brand_01.reader.structDataSize = local_90.structDataSize;
    brand_01.reader.structPointerCount = local_90.structPointerCount;
    brand_01.reader.elementSize = local_90.elementSize;
    brand_01.reader._39_1_ = local_90._39_1_;
    brand_01.reader.nestingLimit = local_90.nestingLimit;
    brand_01.reader._44_4_ = local_90._44_4_;
    evaluateBrand((BrandScope *)&local_248,(Resolver *)this,(ResolvedDecl *)resolver,brand_01,
                  (uint)local_348);
    (__return_storage_ptr__->source)._reader.data = (void *)0x0;
    (__return_storage_ptr__->source)._reader.pointers = (WirePointer *)0x0;
    (__return_storage_ptr__->source)._reader.segment = (SegmentReader *)0x0;
    (__return_storage_ptr__->source)._reader.capTable = (CapTableReader *)0x0;
    (__return_storage_ptr__->source)._reader.dataSize = 0;
    (__return_storage_ptr__->source)._reader.pointerCount = 0;
    *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = 0;
    (__return_storage_ptr__->brand).disposer = (Disposer *)local_248.body._0_8_;
    (__return_storage_ptr__->brand).ptr = (BrandScope *)local_248.body.field_1.forceAligned;
    *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = 0x7fffffff;
    (__return_storage_ptr__->body).field_1.forceAligned = local_4f8;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uStack_4f0;
    *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 0x10) = local_4e8;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = _iStack_4e0;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) = local_4d8;
    (__return_storage_ptr__->body).field_1.space[0x28] = (byte)uStack_6c0;
    if ((byte)uStack_6c0 == '\0') goto LAB_001c8bc5;
LAB_001c8bb9:
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x50) = (undefined4)local_3e8;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x54) = local_3e8._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x58) = (undefined4)uStack_3e0;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x5c) = uStack_3e0._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x40) = (undefined4)local_3f8;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x44) = local_3f8._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x48) = (undefined4)uStack_3f0;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x4c) = uStack_3f0._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x30) = (undefined4)local_408;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x34) = local_408._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x38) = (undefined4)uStack_400;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x3c) = uStack_400._4_4_;
LAB_001c8bc5:
    (__return_storage_ptr__->body).tag = 1;
    return __return_storage_ptr__;
  case 0x12:
    if ((type._reader.dataSize < 0x50) ||
       (sVar1 = *(short *)((long)type._reader.data + 8), sVar1 == 0)) {
      which = BUILTIN_ANY_POINTER;
      break;
    }
    if (sVar1 != 1) {
      if (sVar1 == 2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                  ((Fault *)local_6e8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x4d2,FAILED,(char *)0x0,"\"Alias pointed to implicit method type parameter?\"",
                   (char (*) [49])"Alias pointed to implicit method type parameter?");
        kj::_::Debug::Fault::fatal((Fault *)local_6e8);
      }
      goto switchD_001c8178_default;
    }
    if (type._reader.dataSize < 0xc0) {
      scopeId = (void *)0x0;
      uVar14 = 0;
      if (0x5f < type._reader.dataSize) goto LAB_001c8e47;
    }
    else {
      scopeId = *(void **)((long)type._reader.data + 0x10);
LAB_001c8e47:
      uVar14 = (uint)*(ushort *)((long)type._reader.data + 10);
    }
    lookupParameter(&local_608,this,resolver,(uint64_t)scopeId,uVar14);
    uVar12 = local_608.ptr.field_1.value.brand.ptr;
    local_6e8[0] = local_608.ptr.isSet;
    if (local_608.ptr.isSet != true) {
      (__return_storage_ptr__->source)._reader.data = (void *)0x0;
      (__return_storage_ptr__->source)._reader.pointers = (WirePointer *)0x0;
      (__return_storage_ptr__->source)._reader.segment = (SegmentReader *)0x0;
      (__return_storage_ptr__->source)._reader.capTable = (CapTableReader *)0x0;
      (__return_storage_ptr__->brand).disposer = (Disposer *)0x0;
      (__return_storage_ptr__->brand).ptr = (BrandScope *)0x0;
      (__return_storage_ptr__->source)._reader.dataSize = 0;
      (__return_storage_ptr__->source)._reader.pointerCount = 0;
      *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = 0;
      *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = 0x7fffffff;
      (__return_storage_ptr__->body).field_1.forceAligned = scopeId;
      *(uint *)((long)&(__return_storage_ptr__->body).field_1 + 8) = uVar14;
      (__return_storage_ptr__->body).tag = 2;
      return __return_storage_ptr__;
    }
    local_6e8._8_4_ = local_608.ptr.field_1.value.body.tag;
    if (local_608.ptr.field_1.value.body.tag == 2) {
      local_6d8 = (WirePointer *)local_608.ptr.field_1._8_8_;
      _iStack_6d0 = local_608.ptr.field_1._16_8_;
    }
    else if (local_608.ptr.field_1.value.body.tag == 1) {
      local_6b8 = local_608.ptr.field_1._40_8_;
      local_6d8 = (WirePointer *)local_608.ptr.field_1._8_8_;
      _iStack_6d0 = local_608.ptr.field_1._16_8_;
      bStack_6b0 = local_608.ptr.field_1._48_1_;
      if (local_608.ptr.field_1._48_1_ == 1) {
        local_688 = local_608.ptr.field_1._88_8_;
        uStack_680 = local_608.ptr.field_1._96_8_;
        local_698 = local_608.ptr.field_1._72_8_;
        uStack_690 = local_608.ptr.field_1._80_8_;
        local_6a8 = local_608.ptr.field_1._56_8_;
        uStack_6a0 = local_608.ptr.field_1._64_8_;
      }
    }
    local_678 = (StructReader *)local_608.ptr.field_1.value.brand.disposer;
    local_670 = local_608.ptr.field_1.value.brand.ptr;
    local_668 = local_608.ptr.field_1.value.source._reader.segment;
    pCStack_660 = local_608.ptr.field_1.value.source._reader.capTable;
    local_658 = local_608.ptr.field_1.value.source._reader.data;
    pWStack_650 = local_608.ptr.field_1.value.source._reader.pointers;
    local_648 = local_608.ptr.field_1._152_8_;
    uStack_640 = local_608.ptr.field_1._160_8_;
    BrandedDecl::BrandedDecl(__return_storage_ptr__,(BrandedDecl *)(local_6e8 + 8));
    if ((BrandScope *)uVar12 == (BrandScope *)0x0) {
      return __return_storage_ptr__;
    }
    p_Var13 = (((BrandScope *)uVar12)->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
              (long)&(((BrandScope *)uVar12)->super_Refcounted).super_Disposer._vptr_Disposer;
    pSVar9 = (SegmentReader *)(local_608.ptr.field_1.value.brand.disposer)->_vptr_Disposer;
LAB_001c8e3c:
    (*(code *)pSVar9->arena)(local_608.ptr.field_1.value.brand.disposer,p_Var13);
    return __return_storage_ptr__;
  default:
switchD_001c8178_default:
    kj::_::unreachable();
  }
LAB_001c8134:
  decompileType::anon_class_16_2_36210f71::operator()(__return_storage_ptr__,&local_6f8,which);
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::BrandedDecl NodeTranslator::BrandScope::decompileType(
    Resolver& resolver, schema::Type::Reader type) {
  auto builtin = [&](Declaration::Which which) -> BrandedDecl {
    auto decl = resolver.resolveBuiltin(which);
    return BrandedDecl(decl,
        evaluateBrand(resolver, decl, List<schema::Brand::Scope>::Reader()),
        Expression::Reader());
  };

  switch (type.which()) {
    case schema::Type::VOID:    return builtin(Declaration::BUILTIN_VOID);
    case schema::Type::BOOL:    return builtin(Declaration::BUILTIN_BOOL);
    case schema::Type::INT8:    return builtin(Declaration::BUILTIN_INT8);
    case schema::Type::INT16:   return builtin(Declaration::BUILTIN_INT16);
    case schema::Type::INT32:   return builtin(Declaration::BUILTIN_INT32);
    case schema::Type::INT64:   return builtin(Declaration::BUILTIN_INT64);
    case schema::Type::UINT8:   return builtin(Declaration::BUILTIN_U_INT8);
    case schema::Type::UINT16:  return builtin(Declaration::BUILTIN_U_INT16);
    case schema::Type::UINT32:  return builtin(Declaration::BUILTIN_U_INT32);
    case schema::Type::UINT64:  return builtin(Declaration::BUILTIN_U_INT64);
    case schema::Type::FLOAT32: return builtin(Declaration::BUILTIN_FLOAT32);
    case schema::Type::FLOAT64: return builtin(Declaration::BUILTIN_FLOAT64);
    case schema::Type::TEXT:    return builtin(Declaration::BUILTIN_TEXT);
    case schema::Type::DATA:    return builtin(Declaration::BUILTIN_DATA);

    case schema::Type::ENUM: {
      auto enumType = type.getEnum();
      Resolver::ResolvedDecl decl = resolver.resolveId(enumType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, enumType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = type.getInterface();
      Resolver::ResolvedDecl decl = resolver.resolveId(interfaceType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, interfaceType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::STRUCT: {
      auto structType = type.getStruct();
      Resolver::ResolvedDecl decl = resolver.resolveId(structType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, structType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::LIST: {
      auto elementType = decompileType(resolver, type.getList().getElementType());
      return KJ_ASSERT_NONNULL(builtin(Declaration::BUILTIN_LIST)
          .applyParams(kj::heapArray(&elementType, 1), Expression::Reader()));
    }

    case schema::Type::ANY_POINTER: {
      auto anyPointer = type.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return builtin(Declaration::BUILTIN_ANY_POINTER);

        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          auto id = param.getScopeId();
          uint index = param.getParameterIndex();
          KJ_IF_MAYBE(binding, lookupParameter(resolver, id, index)) {
            return *binding;
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {id, index}, Expression::Reader());
          }
        }

        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          KJ_FAIL_ASSERT("Alias pointed to implicit method type parameter?");
      }

      KJ_UNREACHABLE;
    }
  }